

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_filter.cpp
# Opt level: O3

bool __thiscall
duckdb::ExpressionFilter::EvaluateWithConstant
          (ExpressionFilter *this,ClientContext *context,Value *val)

{
  bool bVar1;
  type expression;
  ExpressionExecutor *this_00;
  ExpressionExecutor executor;
  ExpressionExecutor local_60;
  
  expression = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&this->expr);
  this_00 = &local_60;
  ExpressionExecutor::ExpressionExecutor(&local_60,context,expression);
  bVar1 = EvaluateWithConstant((ExpressionFilter *)this_00,&local_60,val);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
  ::~vector(&local_60.states.
             super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
           );
  if (local_60.expressions.
      super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.expressions.
                    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    .
                    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool ExpressionFilter::EvaluateWithConstant(ClientContext &context, const Value &val) {
	ExpressionExecutor executor(context, *expr);
	return EvaluateWithConstant(executor, val);
}